

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamToolsIndex::LoadHeader(BamToolsIndex *this)

{
  undefined8 uVar1;
  long in_RDI;
  BamToolsIndex *in_stack_00000050;
  int64_t numBytesRead;
  BamToolsIndex *in_stack_00000120;
  allocator local_69;
  string local_68 [8];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  BamException *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  CheckMagicNumber(in_stack_00000050);
  CheckVersion(in_stack_00000120);
  local_10 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x28))
                       (*(long **)(in_RDI + 0x60),in_RDI + 0x50,4);
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32((uint32_t *)(in_RDI + 0x50));
  }
  if (local_10 != 4) {
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"BamToolsIndex::LoadHeader",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"could not read BTI block size",&local_69);
    BamException::BamException
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamToolsIndex::LoadHeader()
{

    // check BTI file metadata
    CheckMagicNumber();
    CheckVersion();

    // use file's BTI block size to set member variable
    const int64_t numBytesRead = m_resources.Device->Read((char*)&m_blockSize, sizeof(m_blockSize));
    if (m_isBigEndian) {
        SwapEndian_32(m_blockSize);
    }
    if (numBytesRead != sizeof(m_blockSize)) {
        throw BamException("BamToolsIndex::LoadHeader", "could not read BTI block size");
    }
}